

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodeTreeUpdatePosSize
               (ImGuiDockNode *node,ImVec2 pos,ImVec2 size,bool only_write_to_marked_nodes)

{
  ushort uVar1;
  ImGuiDockNode *node_00;
  ImGuiDockNode *node_01;
  ulong uVar2;
  short sVar3;
  ImVec2 *pIVar4;
  undefined7 in_register_00000031;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImVec2 child_1_size;
  ImVec2 child_0_size;
  ImVec2 child_1_pos;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 local_10;
  
  pIVar4 = &local_28;
  local_10 = size;
  if (((int)CONCAT71(in_register_00000031,only_write_to_marked_nodes) == 0) ||
     ((node->field_0xba & 8) != 0)) {
    node->Pos = pos;
    node->Size = size;
  }
  node_00 = node->ChildNodes[0];
  if (node_00 == (ImGuiDockNode *)0x0) {
    return;
  }
  node_01 = node->ChildNodes[1];
  local_18 = pos;
  local_20 = size;
  local_28 = size;
  if (((*(uint *)&node_00->field_0xb8 >> 9 & 1) == 0) ||
     ((*(uint *)&node_01->field_0xb8 >> 9 & 1) == 0)) goto LAB_00142f5f;
  uVar2 = (ulong)node->SplitAxis;
  if (1 < uVar2) {
    __assert_fail("idx <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                  ,0xe2,"float &ImVec2::operator[](size_t)");
  }
  fVar6 = (&local_10.x)[uVar2] + -2.0;
  fVar6 = (float)(-(uint)(0.0 <= fVar6) & (uint)fVar6);
  sVar3 = (short)*(uint *)&node_01->field_0xb8;
  if ((short)*(uint *)&node_00->field_0xb8 < 0) {
    if (sVar3 < 0) {
      fVar7 = (float)(int)(((&local_20.x)[uVar2] / ((&local_28.x)[uVar2] + (&local_20.x)[uVar2])) *
                          fVar6);
      *(float *)((long)node_00->ChildNodes + uVar2 * 4 + 0x38) = fVar7;
      (&local_20.x)[uVar2] = fVar7;
      fVar6 = fVar6 - fVar7;
      *(float *)((long)node_01->ChildNodes + uVar2 * 4 + 0x38) = fVar6;
      (&local_28.x)[uVar2] = fVar6;
      if ((*(float *)((long)node_00->ChildNodes + uVar2 * 4 + 0x38) <= 0.0) || (fVar6 <= 0.0)) {
        __assert_fail("child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x36d2,
                      "void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode *, ImVec2, ImVec2, bool)"
                     );
      }
    }
    else {
      fVar8 = *(float *)((long)node_00->ChildNodes + uVar2 * 4 + 0x30);
      fVar7 = fVar6 + -1.0;
      if (fVar8 <= fVar6 + -1.0) {
        fVar7 = fVar8;
      }
      *(float *)((long)node_00->ChildNodes + uVar2 * 4 + 0x38) = fVar7;
      (&local_20.x)[uVar2] = fVar7;
      fVar6 = fVar6 - fVar7;
      *(float *)((long)node_01->ChildNodes + uVar2 * 4 + 0x38) = fVar6;
      (&local_28.x)[uVar2] = fVar6;
      if ((*(float *)((long)node_00->ChildNodes + uVar2 * 4 + 0x38) <= 0.0) || (fVar6 <= 0.0)) {
        __assert_fail("child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                      ,0x36c3,
                      "void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode *, ImVec2, ImVec2, bool)"
                     );
      }
    }
  }
  else if (sVar3 < 0) {
    fVar8 = *(float *)((long)node_01->ChildNodes + uVar2 * 4 + 0x30);
    fVar7 = fVar6 + -1.0;
    if (fVar8 <= fVar6 + -1.0) {
      fVar7 = fVar8;
    }
    *(float *)((long)node_01->ChildNodes + uVar2 * 4 + 0x38) = fVar7;
    (&local_28.x)[uVar2] = fVar7;
    fVar7 = fVar6 - fVar7;
    *(float *)((long)node_00->ChildNodes + uVar2 * 4 + 0x38) = fVar7;
    (&local_20.x)[uVar2] = fVar7;
    if ((fVar7 <= 0.0) || (*(float *)((long)node_01->ChildNodes + uVar2 * 4 + 0x38) <= 0.0)) {
      __assert_fail("child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x36c9,
                    "void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode *, ImVec2, ImVec2, bool)");
    }
  }
  else {
    fVar7 = (&(GImGui->Style).WindowMinSize.x)[uVar2];
    fVar7 = fVar7 + fVar7;
    fVar8 = fVar6;
    if (fVar7 <= fVar6) {
      fVar8 = fVar7;
    }
    fVar8 = (float)(int)(fVar8 * 0.5);
    if ((node_01->LocalFlags & 0x800) == 0) {
LAB_00142df4:
      fVar7 = *(float *)((long)node_01->ChildNodes + uVar2 * 4 + 0x38);
      if (((node_00->LocalFlags & 0x800) == 0) || ((fVar7 == 0.0 && (!NAN(fVar7))))) {
        fVar9 = *(float *)((long)node_00->ChildNodes + uVar2 * 4 + 0x38);
        fVar7 = (float)(int)((fVar9 / (fVar7 + fVar9)) * fVar6 + 0.5);
        uVar5 = -(uint)(fVar7 <= fVar8);
        fVar7 = (float)(uVar5 & (uint)fVar8 | ~uVar5 & (uint)fVar7);
        goto LAB_00142f39;
      }
      fVar9 = fVar6 - fVar8;
      if (fVar7 <= fVar6 - fVar8) {
        fVar9 = fVar7;
      }
      (&local_28.x)[uVar2] = fVar9;
      fVar6 = fVar6 - fVar9;
      pIVar4 = &local_20;
      fVar7 = fVar6;
    }
    else {
      fVar9 = *(float *)((long)node_00->ChildNodes + uVar2 * 4 + 0x38);
      if ((fVar9 == 0.0) && (!NAN(fVar9))) goto LAB_00142df4;
      fVar7 = fVar6 - fVar8;
      if (fVar9 <= fVar6 - fVar8) {
        fVar7 = fVar9;
      }
LAB_00142f39:
      (&local_20.x)[uVar2] = fVar7;
      fVar6 = fVar6 - fVar7;
    }
    (&pIVar4->x)[uVar2] = fVar6;
  }
  (&local_18.x)[uVar2] = fVar7 + 2.0 + (&local_18.x)[uVar2];
LAB_00142f5f:
  node_01->field_0xb9 = node_01->field_0xb9 & 0x7f;
  uVar1 = *(ushort *)&node_00->field_0xb8;
  *(ushort *)&node_00->field_0xb8 = uVar1 & 0x7fff;
  if ((uVar1 >> 9 & 1) != 0) {
    DockNodeTreeUpdatePosSize(node_00,pos,local_20,false);
  }
  if ((node_01->field_0xb9 & 2) != 0) {
    DockNodeTreeUpdatePosSize(node_01,local_18,local_28,false);
  }
  return;
}

Assistant:

void ImGui::DockNodeTreeUpdatePosSize(ImGuiDockNode* node, ImVec2 pos, ImVec2 size, bool only_write_to_marked_nodes)
{
    // During the regular dock node update we write to all nodes.
    // 'only_write_to_marked_nodes' is only set when turning a node visible mid-frame and we need its size right-away.
    const bool write_to_node = (only_write_to_marked_nodes == false) || (node->MarkedForPosSizeWrite);
    if (write_to_node)
    {
        node->Pos = pos;
        node->Size = size;
    }

    if (node->IsLeafNode())
        return;

    ImGuiDockNode* child_0 = node->ChildNodes[0];
    ImGuiDockNode* child_1 = node->ChildNodes[1];
    ImVec2 child_0_pos = pos, child_1_pos = pos;
    ImVec2 child_0_size = size, child_1_size = size;
    if (child_0->IsVisible && child_1->IsVisible)
    {
        const float spacing = DOCKING_SPLITTER_SIZE;
        const ImGuiAxis axis = (ImGuiAxis)node->SplitAxis;
        const float size_avail = ImMax(size[axis] - spacing, 0.0f);

        // Size allocation policy
        // 1) The first 0..WindowMinSize[axis]*2 are allocated evenly to both windows.
        ImGuiContext& g = *GImGui;
        const float size_min_each = ImFloor(ImMin(size_avail, g.Style.WindowMinSize[axis] * 2.0f) * 0.5f);

        // 2) Process locked absolute size (during a splitter resize we preserve the child of nodes not touching the splitter edge)
        if (child_0->WantLockSizeOnce && !child_1->WantLockSizeOnce)
        {
            child_0_size[axis] = child_0->SizeRef[axis] = ImMin(size_avail - 1.0f, child_0->Size[axis]);
            child_1_size[axis] = child_1->SizeRef[axis] = (size_avail - child_0_size[axis]);
            IM_ASSERT(child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f);
        }
        else if (child_1->WantLockSizeOnce && !child_0->WantLockSizeOnce)
        {
            child_1_size[axis] = child_1->SizeRef[axis] = ImMin(size_avail - 1.0f, child_1->Size[axis]);
            child_0_size[axis] = child_0->SizeRef[axis] = (size_avail - child_1_size[axis]);
            IM_ASSERT(child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f);
        }
        else if (child_0->WantLockSizeOnce && child_1->WantLockSizeOnce)
        {
            // FIXME-DOCK: We cannot honor the requested size, so apply ratio.
            // Currently this path will only be taken if code programmatically sets WantLockSizeOnce
            float ratio_0 = child_0_size[axis] / (child_0_size[axis] + child_1_size[axis]);
            child_0_size[axis] = child_0->SizeRef[axis] = ImFloor(size_avail * ratio_0);
            child_1_size[axis] = child_1->SizeRef[axis] = (size_avail - child_0_size[axis]);
            IM_ASSERT(child_0->SizeRef[axis] > 0.0f && child_1->SizeRef[axis] > 0.0f);
        }

        // 3) If one window is the central node (~ use remaining space, should be made explicit!), use explicit size from the other, and remainder for the central node
        else if (child_1->IsCentralNode() && child_0->SizeRef[axis] != 0.0f)
        {
            child_0_size[axis] = ImMin(size_avail - size_min_each, child_0->SizeRef[axis]);
            child_1_size[axis] = (size_avail - child_0_size[axis]);
        }
        else if (child_0->IsCentralNode() && child_1->SizeRef[axis] != 0.0f)
        {
            child_1_size[axis] = ImMin(size_avail - size_min_each, child_1->SizeRef[axis]);
            child_0_size[axis] = (size_avail - child_1_size[axis]);
        }
        else
        {
            // 4) Otherwise distribute according to the relative ratio of each SizeRef value
            float split_ratio = child_0->SizeRef[axis] / (child_0->SizeRef[axis] + child_1->SizeRef[axis]);
            child_0_size[axis] = ImMax(size_min_each, ImFloor(size_avail * split_ratio + 0.5F));
            child_1_size[axis] = (size_avail - child_0_size[axis]);
        }

        child_1_pos[axis] += spacing + child_0_size[axis];
    }
    child_0->WantLockSizeOnce = child_1->WantLockSizeOnce = false;

    if (child_0->IsVisible)
        DockNodeTreeUpdatePosSize(child_0, child_0_pos, child_0_size);
    if (child_1->IsVisible)
        DockNodeTreeUpdatePosSize(child_1, child_1_pos, child_1_size);
}